

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.cpp
# Opt level: O0

void ggml_vec_dot_f16(int n,float *s,size_t bs,ggml_fp16_t *x,size_t bx,ggml_fp16_t *y,size_t by,
                     int nrc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  long in_RCX;
  long lVar10;
  long lVar11;
  long lVar12;
  float *in_RSI;
  uint in_EDI;
  long in_R9;
  undefined1 auVar15 [16];
  float fVar13;
  float fVar14;
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int offset;
  int j;
  int i;
  __m512 ay [4];
  __m512 ax [4];
  __m512 sum [4];
  int np;
  ggml_float sumf;
  uint local_79c;
  int local_798;
  int local_794;
  int local_790;
  int local_788;
  int local_784;
  undefined8 local_780 [32];
  undefined8 local_680 [32];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  uint local_47c;
  double local_478;
  long local_470;
  long local_460;
  float *local_450;
  uint local_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 (*local_60) [32];
  undefined1 (*local_58) [32];
  
  local_478 = 0.0;
  local_47c = in_EDI & 0xffffffc0;
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  local_4c0 = vmovdqa64_avx512f(auVar16);
  local_500 = vmovdqa64_avx512f(auVar16);
  local_540 = vmovdqa64_avx512f(auVar16);
  vmovdqa64_avx512f(auVar16);
  local_440 = 0;
  uStack_438 = 0;
  uStack_430 = 0;
  uStack_428 = 0;
  uStack_420 = 0;
  uStack_418 = 0;
  uStack_410 = 0;
  uStack_408 = 0;
  local_580 = ZEXT1664(ZEXT816(0));
  local_470 = in_R9;
  local_460 = in_RCX;
  local_450 = in_RSI;
  local_444 = in_EDI;
  for (local_784 = 0; local_784 < (int)local_47c; local_784 = local_784 + 0x40) {
    for (local_788 = 0; local_788 < 4; local_788 = local_788 + 1) {
      local_58 = (undefined1 (*) [32])(local_460 + (long)local_784 * 2 + (long)(local_788 << 4) * 2)
      ;
      local_e0 = *(undefined8 *)*local_58;
      uStack_d8 = *(undefined8 *)(*local_58 + 8);
      uStack_d0 = *(undefined8 *)(*local_58 + 0x10);
      uStack_c8 = *(undefined8 *)(*local_58 + 0x18);
      auVar16 = vcvtph2ps_avx512f(*local_58);
      local_c0 = 0;
      uStack_b8 = 0;
      uStack_b0 = 0;
      uStack_a8 = 0;
      uStack_a0 = 0;
      uStack_98 = 0;
      uStack_90 = 0;
      uStack_88 = 0;
      *(undefined1 (*) [64])(local_680 + (long)local_788 * 8) = auVar16;
      local_60 = (undefined1 (*) [32])(local_470 + (long)local_784 * 2 + (long)(local_788 << 4) * 2)
      ;
      local_160 = *(undefined8 *)*local_60;
      uStack_158 = *(undefined8 *)(*local_60 + 8);
      uStack_150 = *(undefined8 *)(*local_60 + 0x10);
      uStack_148 = *(undefined8 *)(*local_60 + 0x18);
      auVar16 = vcvtph2ps_avx512f(*local_60);
      local_140 = 0;
      uStack_138 = 0;
      uStack_130 = 0;
      uStack_128 = 0;
      uStack_120 = 0;
      uStack_118 = 0;
      uStack_110 = 0;
      uStack_108 = 0;
      *(undefined1 (*) [64])(local_780 + (long)local_788 * 8) = auVar16;
      lVar10 = (long)local_788;
      lVar11 = (long)local_788;
      lVar12 = (long)local_788 * 0x40;
      local_380 = local_680[lVar10 * 8];
      uStack_378 = local_680[lVar10 * 8 + 1];
      uStack_370 = local_680[lVar10 * 8 + 2];
      uStack_368 = local_680[lVar10 * 8 + 3];
      uStack_360 = local_680[lVar10 * 8 + 4];
      uStack_358 = local_680[lVar10 * 8 + 5];
      uStack_350 = local_680[lVar10 * 8 + 6];
      uStack_348 = local_680[lVar10 * 8 + 7];
      local_3c0 = local_780[lVar11 * 8];
      uStack_3b8 = local_780[lVar11 * 8 + 1];
      uStack_3b0 = local_780[lVar11 * 8 + 2];
      uStack_3a8 = local_780[lVar11 * 8 + 3];
      uStack_3a0 = local_780[lVar11 * 8 + 4];
      uStack_398 = local_780[lVar11 * 8 + 5];
      uStack_390 = local_780[lVar11 * 8 + 6];
      uStack_388 = local_780[lVar11 * 8 + 7];
      local_400 = *(undefined8 *)(local_580 + lVar12);
      uStack_3f8 = *(undefined8 *)(local_580 + lVar12 + 8);
      uStack_3f0 = *(undefined8 *)(local_580 + lVar12 + 0x10);
      uStack_3e8 = *(undefined8 *)(local_580 + lVar12 + 0x18);
      uStack_3e0 = *(undefined8 *)(local_580 + lVar12 + 0x20);
      uStack_3d8 = *(undefined8 *)(local_540 + lVar12 + -0x18);
      uStack_3d0 = *(undefined8 *)(local_540 + lVar12 + -0x10);
      uStack_3c8 = *(undefined8 *)(local_540 + lVar12 + -8);
      auVar3._8_8_ = local_680[lVar10 * 8 + 1];
      auVar3._0_8_ = local_680[lVar10 * 8];
      auVar3._16_8_ = local_680[lVar10 * 8 + 2];
      auVar3._24_8_ = local_680[lVar10 * 8 + 3];
      auVar3._32_8_ = local_680[lVar10 * 8 + 4];
      auVar3._40_8_ = local_680[lVar10 * 8 + 5];
      auVar3._48_8_ = local_680[lVar10 * 8 + 6];
      auVar3._56_8_ = local_680[lVar10 * 8 + 7];
      auVar2._8_8_ = local_780[lVar11 * 8 + 1];
      auVar2._0_8_ = local_780[lVar11 * 8];
      auVar2._16_8_ = local_780[lVar11 * 8 + 2];
      auVar2._24_8_ = local_780[lVar11 * 8 + 3];
      auVar2._32_8_ = local_780[lVar11 * 8 + 4];
      auVar2._40_8_ = local_780[lVar11 * 8 + 5];
      auVar2._48_8_ = local_780[lVar11 * 8 + 6];
      auVar2._56_8_ = local_780[lVar11 * 8 + 7];
      auVar16._8_8_ = *(undefined8 *)(local_580 + lVar12 + 8);
      auVar16._0_8_ = *(undefined8 *)(local_580 + lVar12);
      auVar16._16_8_ = *(undefined8 *)(local_580 + lVar12 + 0x10);
      auVar16._24_8_ = *(undefined8 *)(local_580 + lVar12 + 0x18);
      auVar16._32_8_ = *(undefined8 *)(local_580 + lVar12 + 0x20);
      auVar16._40_8_ = *(undefined8 *)(local_540 + lVar12 + -0x18);
      auVar16._48_8_ = *(undefined8 *)(local_540 + lVar12 + -0x10);
      auVar16._56_8_ = *(undefined8 *)(local_540 + lVar12 + -8);
      auVar16 = vfmadd213ps_avx512f(auVar2,auVar3,auVar16);
      *(undefined1 (*) [64])(local_580 + (long)local_788 * 0x40) = auVar16;
    }
  }
  for (local_790 = 0; local_790 < 2; local_790 = local_790 + 1) {
    lVar10 = (long)local_790 * 0x40;
    lVar11 = (long)(local_790 + 2) * 0x40;
    local_200 = *(undefined8 *)(local_580 + lVar10);
    uStack_1f8 = *(undefined8 *)(local_580 + lVar10 + 8);
    uStack_1f0 = *(undefined8 *)(local_580 + lVar10 + 0x10);
    uStack_1e8 = *(undefined8 *)(local_580 + lVar10 + 0x18);
    uStack_1e0 = *(undefined8 *)(local_580 + lVar10 + 0x20);
    uStack_1d8 = *(undefined8 *)(local_540 + lVar10 + -0x18);
    uStack_1d0 = *(undefined8 *)(local_540 + lVar10 + -0x10);
    uStack_1c8 = *(undefined8 *)(local_540 + lVar10 + -8);
    local_240 = *(undefined8 *)(local_580 + lVar11);
    uStack_238 = *(undefined8 *)(local_580 + lVar11 + 8);
    uStack_230 = *(undefined8 *)(local_580 + lVar11 + 0x10);
    uStack_228 = *(undefined8 *)(local_580 + lVar11 + 0x18);
    uStack_220 = *(undefined8 *)(local_580 + lVar11 + 0x20);
    uStack_218 = *(undefined8 *)(local_540 + lVar11 + -0x18);
    uStack_210 = *(undefined8 *)(local_540 + lVar11 + -0x10);
    uStack_208 = *(undefined8 *)(local_540 + lVar11 + -8);
    auVar9._8_8_ = *(undefined8 *)(local_580 + lVar10 + 8);
    auVar9._0_8_ = *(undefined8 *)(local_580 + lVar10);
    auVar9._16_8_ = *(undefined8 *)(local_580 + lVar10 + 0x10);
    auVar9._24_8_ = *(undefined8 *)(local_580 + lVar10 + 0x18);
    auVar9._32_8_ = *(undefined8 *)(local_580 + lVar10 + 0x20);
    auVar9._40_8_ = *(undefined8 *)(local_540 + lVar10 + -0x18);
    auVar9._48_8_ = *(undefined8 *)(local_540 + lVar10 + -0x10);
    auVar9._56_8_ = *(undefined8 *)(local_540 + lVar10 + -8);
    auVar8._8_8_ = *(undefined8 *)(local_580 + lVar11 + 8);
    auVar8._0_8_ = *(undefined8 *)(local_580 + lVar11);
    auVar8._16_8_ = *(undefined8 *)(local_580 + lVar11 + 0x10);
    auVar8._24_8_ = *(undefined8 *)(local_580 + lVar11 + 0x18);
    auVar8._32_8_ = *(undefined8 *)(local_580 + lVar11 + 0x20);
    auVar8._40_8_ = *(undefined8 *)(local_540 + lVar11 + -0x18);
    auVar8._48_8_ = *(undefined8 *)(local_540 + lVar11 + -0x10);
    auVar8._56_8_ = *(undefined8 *)(local_540 + lVar11 + -8);
    auVar16 = vaddps_avx512f(auVar9,auVar8);
    *(undefined1 (*) [64])(local_580 + (long)local_790 * 0x40) = auVar16;
  }
  for (local_794 = 0; local_794 < 1; local_794 = local_794 + 1) {
    lVar10 = (long)local_794 * 0x40;
    lVar11 = (long)(local_794 + 1) * 0x40;
    local_280 = *(undefined8 *)(local_580 + lVar10);
    uStack_278 = *(undefined8 *)(local_580 + lVar10 + 8);
    uStack_270 = *(undefined8 *)(local_580 + lVar10 + 0x10);
    uStack_268 = *(undefined8 *)(local_580 + lVar10 + 0x18);
    uStack_260 = *(undefined8 *)(local_580 + lVar10 + 0x20);
    uStack_258 = *(undefined8 *)(local_540 + lVar10 + -0x18);
    uStack_250 = *(undefined8 *)(local_540 + lVar10 + -0x10);
    uStack_248 = *(undefined8 *)(local_540 + lVar10 + -8);
    local_2c0 = *(undefined8 *)(local_580 + lVar11);
    uStack_2b8 = *(undefined8 *)(local_580 + lVar11 + 8);
    uStack_2b0 = *(undefined8 *)(local_580 + lVar11 + 0x10);
    uStack_2a8 = *(undefined8 *)(local_580 + lVar11 + 0x18);
    uStack_2a0 = *(undefined8 *)(local_580 + lVar11 + 0x20);
    uStack_298 = *(undefined8 *)(local_540 + lVar11 + -0x18);
    uStack_290 = *(undefined8 *)(local_540 + lVar11 + -0x10);
    uStack_288 = *(undefined8 *)(local_540 + lVar11 + -8);
    auVar7._8_8_ = *(undefined8 *)(local_580 + lVar10 + 8);
    auVar7._0_8_ = *(undefined8 *)(local_580 + lVar10);
    auVar7._16_8_ = *(undefined8 *)(local_580 + lVar10 + 0x10);
    auVar7._24_8_ = *(undefined8 *)(local_580 + lVar10 + 0x18);
    auVar7._32_8_ = *(undefined8 *)(local_580 + lVar10 + 0x20);
    auVar7._40_8_ = *(undefined8 *)(local_540 + lVar10 + -0x18);
    auVar7._48_8_ = *(undefined8 *)(local_540 + lVar10 + -0x10);
    auVar7._56_8_ = *(undefined8 *)(local_540 + lVar10 + -8);
    auVar6._8_8_ = *(undefined8 *)(local_580 + lVar11 + 8);
    auVar6._0_8_ = *(undefined8 *)(local_580 + lVar11);
    auVar6._16_8_ = *(undefined8 *)(local_580 + lVar11 + 0x10);
    auVar6._24_8_ = *(undefined8 *)(local_580 + lVar11 + 0x18);
    auVar6._32_8_ = *(undefined8 *)(local_580 + lVar11 + 0x20);
    auVar6._40_8_ = *(undefined8 *)(local_540 + lVar11 + -0x18);
    auVar6._48_8_ = *(undefined8 *)(local_540 + lVar11 + -0x10);
    auVar6._56_8_ = *(undefined8 *)(local_540 + lVar11 + -8);
    auVar16 = vaddps_avx512f(auVar7,auVar6);
    *(undefined1 (*) [64])(local_580 + (long)local_794 * 0x40) = auVar16;
  }
  for (local_798 = 0; local_798 < 0; local_798 = local_798 + 1) {
    lVar10 = (long)local_798 * 0x40;
    lVar11 = (long)local_798 * 0x40;
    local_300 = *(undefined8 *)(local_580 + lVar10);
    uStack_2f8 = *(undefined8 *)(local_580 + lVar10 + 8);
    uStack_2f0 = *(undefined8 *)(local_580 + lVar10 + 0x10);
    uStack_2e8 = *(undefined8 *)(local_580 + lVar10 + 0x18);
    uStack_2e0 = *(undefined8 *)(local_580 + lVar10 + 0x20);
    uStack_2d8 = *(undefined8 *)(local_540 + lVar10 + -0x18);
    uStack_2d0 = *(undefined8 *)(local_540 + lVar10 + -0x10);
    uStack_2c8 = *(undefined8 *)(local_540 + lVar10 + -8);
    local_340 = *(undefined8 *)(local_580 + lVar11);
    uStack_338 = *(undefined8 *)(local_580 + lVar11 + 8);
    uStack_330 = *(undefined8 *)(local_580 + lVar11 + 0x10);
    uStack_328 = *(undefined8 *)(local_580 + lVar11 + 0x18);
    uStack_320 = *(undefined8 *)(local_580 + lVar11 + 0x20);
    uStack_318 = *(undefined8 *)(local_540 + lVar11 + -0x18);
    uStack_310 = *(undefined8 *)(local_540 + lVar11 + -0x10);
    uStack_308 = *(undefined8 *)(local_540 + lVar11 + -8);
    auVar5._8_8_ = *(undefined8 *)(local_580 + lVar10 + 8);
    auVar5._0_8_ = *(undefined8 *)(local_580 + lVar10);
    auVar5._16_8_ = *(undefined8 *)(local_580 + lVar10 + 0x10);
    auVar5._24_8_ = *(undefined8 *)(local_580 + lVar10 + 0x18);
    auVar5._32_8_ = *(undefined8 *)(local_580 + lVar10 + 0x20);
    auVar5._40_8_ = *(undefined8 *)(local_540 + lVar10 + -0x18);
    auVar5._48_8_ = *(undefined8 *)(local_540 + lVar10 + -0x10);
    auVar5._56_8_ = *(undefined8 *)(local_540 + lVar10 + -8);
    auVar4._8_8_ = *(undefined8 *)(local_580 + lVar11 + 8);
    auVar4._0_8_ = *(undefined8 *)(local_580 + lVar11);
    auVar4._16_8_ = *(undefined8 *)(local_580 + lVar11 + 0x10);
    auVar4._24_8_ = *(undefined8 *)(local_580 + lVar11 + 0x18);
    auVar4._32_8_ = *(undefined8 *)(local_580 + lVar11 + 0x20);
    auVar4._40_8_ = *(undefined8 *)(local_540 + lVar11 + -0x18);
    auVar4._48_8_ = *(undefined8 *)(local_540 + lVar11 + -0x10);
    auVar4._56_8_ = *(undefined8 *)(local_540 + lVar11 + -8);
    auVar16 = vaddps_avx512f(auVar5,auVar4);
    *(undefined1 (*) [64])(local_580 + (long)local_798 * 0x40) = auVar16;
  }
  local_1c0 = local_580._0_8_;
  uStack_1b8 = local_580._8_8_;
  uStack_1b0 = local_580._16_8_;
  uStack_1a8 = local_580._24_8_;
  uStack_1a0 = local_580._32_8_;
  uStack_198 = local_580._40_8_;
  uStack_190 = local_580._48_8_;
  uStack_188 = local_580._56_8_;
  auVar16 = vaddps_avx512f(local_580,ZEXT3264(local_580._32_32_));
  auVar15._0_4_ = auVar16._0_4_ + auVar16._16_4_;
  auVar15._4_4_ = auVar16._4_4_ + auVar16._20_4_;
  auVar15._8_4_ = auVar16._8_4_ + auVar16._24_4_;
  auVar15._12_4_ = auVar16._12_4_ + auVar16._28_4_;
  auVar1 = vpermilpd_avx(auVar15,1);
  auVar17._0_4_ = auVar15._0_4_ + auVar1._0_4_;
  auVar17._4_4_ = auVar15._4_4_ + auVar1._4_4_;
  auVar17._8_4_ = auVar15._8_4_ + auVar1._8_4_;
  auVar17._12_4_ = auVar15._12_4_ + auVar1._12_4_;
  auVar1 = vmovshdup_avx(auVar17);
  local_478 = (double)(auVar17._0_4_ + auVar1._0_4_ + -0.0);
  for (local_79c = local_47c; (int)local_79c < (int)local_444; local_79c = local_79c + 1) {
    fVar13 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_460 + (long)(int)local_79c * 2));
    fVar14 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(local_470 + (long)(int)local_79c * 2));
    local_478 = (double)(fVar13 * fVar14) + local_478;
  }
  *local_450 = (float)local_478;
  return;
}

Assistant:

void ggml_vec_dot_f16(int n, float * GGML_RESTRICT s, size_t bs, ggml_fp16_t * GGML_RESTRICT x, size_t bx, ggml_fp16_t * GGML_RESTRICT y, size_t by, int nrc) {
    assert(nrc == 1);
    GGML_UNUSED(nrc);
    GGML_UNUSED(bx);
    GGML_UNUSED(by);
    GGML_UNUSED(bs);

    ggml_float sumf = 0.0;

#if defined(GGML_SIMD)
    const int np = (n & ~(GGML_F16_STEP - 1));

    GGML_F16_VEC sum[GGML_F16_ARR] = { GGML_F16_VEC_ZERO };

    GGML_F16_VEC ax[GGML_F16_ARR];
    GGML_F16_VEC ay[GGML_F16_ARR];

    for (int i = 0; i < np; i += GGML_F16_STEP) {
        for (int j = 0; j < GGML_F16_ARR; j++) {
            ax[j] = GGML_F16_VEC_LOAD(x + i + j*GGML_F16_EPR, j);
            ay[j] = GGML_F16_VEC_LOAD(y + i + j*GGML_F16_EPR, j);

            sum[j] = GGML_F16_VEC_FMA(sum[j], ax[j], ay[j]);
        }
    }

    // reduce sum0..sum3 to sum0
    GGML_F16_VEC_REDUCE(sumf, sum);

    // leftovers
    for (int i = np; i < n; ++i) {
        sumf += (ggml_float)(GGML_FP16_TO_FP32(x[i])*GGML_FP16_TO_FP32(y[i]));
    }
#else
    for (int i = 0; i < n; ++i) {
        sumf += (ggml_float)(GGML_FP16_TO_FP32(x[i])*GGML_FP16_TO_FP32(y[i]));
    }
#endif

    *s = sumf;
}